

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::MatchSetNode::IsCharTrieArm(MatchSetNode *this,Compiler *compiler,uint *accNumAlts)

{
  bool bVar1;
  uint uVar2;
  uint count;
  uint *accNumAlts_local;
  Compiler *compiler_local;
  MatchSetNode *this_local;
  
  if (((this->isNegation & 1U) != 0) || (bVar1 = CharSet<char16_t>::IsCompact(&this->set), !bVar1))
  {
    return false;
  }
  uVar2 = CharSet<char16_t>::Count(&this->set);
  if (uVar2 == 0) {
    return false;
  }
  *accNumAlts = uVar2 * *accNumAlts;
  if (0x10 < *accNumAlts) {
    return false;
  }
  return true;
}

Assistant:

bool MatchSetNode::IsCharTrieArm(Compiler& compiler, uint& accNumAlts) const
    {
        if (isNegation || !set.IsCompact())
            return false;
        const uint count = set.Count();
        if(count == 0)
            return false; // empty set always fails and consumes nothing, and therefore is not a char-trie arm
        accNumAlts *= count;
        if (accNumAlts > maxTrieArmExpansion)
            return false;
        return true;
    }